

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsRectItem::setRect(QGraphicsRectItem *this,QRectF *rect)

{
  qreal *r1;
  QGraphicsItemPrivate *pQVar1;
  qreal qVar2;
  qreal qVar3;
  qreal qVar4;
  bool bVar5;
  long in_FS_OFFSET;
  QRectF local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QAbstractGraphicsShapeItem).super_QGraphicsItem.d_ptr.d;
  r1 = &pQVar1[1].childrenBoundingRect.w;
  bVar5 = ::comparesEqual((QRectF *)r1,rect);
  if (!bVar5) {
    QGraphicsItem::prepareGeometryChange((QGraphicsItem *)this);
    qVar2 = rect->xp;
    qVar3 = rect->yp;
    qVar4 = rect->h;
    pQVar1[1].needsRepaint.xp = rect->w;
    pQVar1[1].needsRepaint.yp = qVar4;
    *r1 = qVar2;
    pQVar1[1].childrenBoundingRect.h = qVar3;
    pQVar1[1].childrenBoundingRect.xp = 0.0;
    pQVar1[1].childrenBoundingRect.yp = 0.0;
    pQVar1[1].extras.d.ptr = (ExtraStruct *)0x0;
    pQVar1[1].extras.d.size = 0;
    local_48.w = 0.0;
    local_48.h = 0.0;
    local_48.xp = 0.0;
    local_48.yp = 0.0;
    QGraphicsItem::update((QGraphicsItem *)this,&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsRectItem::setRect(const QRectF &rect)
{
    Q_D(QGraphicsRectItem);
    if (d->rect == rect)
        return;
    prepareGeometryChange();
    d->rect = rect;
    d->boundingRect = QRectF();
    update();
}